

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

int Gia_ManBmcCheckOutputs(Gia_Man_t *pFrames,int iStart,int iStop)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int local_24;
  int i;
  int iStop_local;
  int iStart_local;
  Gia_Man_t *pFrames_local;
  
  local_24 = iStart;
  while( true ) {
    if (iStop <= local_24) {
      return 1;
    }
    pGVar1 = Gia_ManPo(pFrames,local_24);
    pGVar1 = Gia_ObjChild0(pGVar1);
    pGVar2 = Gia_ManConst0(pFrames);
    if (pGVar1 != pGVar2) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int Gia_ManBmcCheckOutputs( Gia_Man_t * pFrames, int iStart, int iStop )
{
    int i;
    for ( i = iStart; i < iStop; i++ )
        if ( Gia_ObjChild0(Gia_ManPo(pFrames, i)) != Gia_ManConst0(pFrames) )
            return 0;
    return 1;
}